

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int little2_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  byte *pbVar2;
  char *pcVar3;
  uint local_84;
  uint local_74;
  uint local_64;
  uint local_5c;
  uint local_54;
  uint local_44;
  int tok;
  int t_1;
  int open;
  int t;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  end_local = ptr;
  ptr_local = (char *)enc;
LAB_00b9b6cb:
  if ((long)end - (long)end_local < 2) {
    enc_local._4_4_ = -1;
  }
  else {
    if (end_local[1] == '\0') {
      local_44 = (uint)(byte)ptr_local[(ulong)(byte)*end_local + 0x80];
    }
    else {
      local_44 = unicode_byte_type(end_local[1],*end_local);
    }
    switch(local_44) {
    case 5:
      if ((long)end - (long)end_local < 2) {
        enc_local._4_4_ = -2;
      }
      else {
        *nextTokPtr = end_local;
        enc_local._4_4_ = 0;
      }
      break;
    case 6:
      if ((long)end - (long)end_local < 3) {
        enc_local._4_4_ = -2;
      }
      else {
        *nextTokPtr = end_local;
        enc_local._4_4_ = 0;
      }
      break;
    case 7:
      if ((long)end - (long)end_local < 4) {
        enc_local._4_4_ = -2;
      }
      else {
        *nextTokPtr = end_local;
        enc_local._4_4_ = 0;
      }
      break;
    default:
      *nextTokPtr = end_local;
      return 0;
    case 9:
    case 10:
    case 0x15:
      while( true ) {
        pbVar2 = (byte *)(end_local + 2);
        if ((long)end - (long)pbVar2 < 2) {
          return -1;
        }
        if (end_local[3] == '\0') {
          local_54 = (uint)(byte)ptr_local[(ulong)*pbVar2 + 0x80];
          end_local = (char *)pbVar2;
        }
        else {
          pcVar3 = end_local + 3;
          end_local = (char *)pbVar2;
          local_54 = unicode_byte_type(*pcVar3,*pbVar2);
        }
        if (local_54 == 0xe) break;
        if ((1 < local_54 - 9) && (local_54 != 0x15)) {
          *nextTokPtr = end_local;
          return 0;
        }
      }
    case 0xe:
      while( true ) {
        pbVar2 = (byte *)(end_local + 2);
        if ((long)end - (long)pbVar2 < 2) {
          return -1;
        }
        if (end_local[3] == '\0') {
          local_5c = (uint)(byte)ptr_local[(ulong)*pbVar2 + 0x80];
          end_local = (char *)pbVar2;
        }
        else {
          pcVar3 = end_local + 3;
          end_local = (char *)pbVar2;
          local_5c = unicode_byte_type(*pcVar3,*pbVar2);
        }
        if ((local_5c == 0xc) || (local_5c == 0xd)) break;
        if ((1 < local_5c - 9) && (local_5c != 0x15)) {
          *nextTokPtr = end_local;
          return 0;
        }
      }
      end_local = end_local + 2;
      while( true ) {
        if ((long)end - (long)end_local < 2) {
          return -1;
        }
        if (end_local[1] == '\0') {
          local_64 = (uint)(byte)ptr_local[(ulong)(byte)*end_local + 0x80];
        }
        else {
          local_64 = unicode_byte_type(end_local[1],*end_local);
        }
        if (local_64 == local_5c) break;
        switch(local_64) {
        case 0:
        case 1:
        case 8:
          *nextTokPtr = end_local;
          return 0;
        case 2:
          *nextTokPtr = end_local;
          return 0;
        case 3:
          iVar1 = little2_scanRef((ENCODING *)ptr_local,end_local + 2,end,&end_local);
          if (iVar1 < 1) {
            if (iVar1 != 0) {
              return iVar1;
            }
            *nextTokPtr = end_local;
            return 0;
          }
          break;
        default:
          end_local = end_local + 2;
          break;
        case 5:
          if ((long)end - (long)end_local < 2) {
            return -2;
          }
          end_local = end_local + 2;
          break;
        case 6:
          if ((long)end - (long)end_local < 3) {
            return -2;
          }
          end_local = end_local + 3;
          break;
        case 7:
          if ((long)end - (long)end_local < 4) {
            return -2;
          }
          end_local = end_local + 4;
        }
      }
      pbVar2 = (byte *)(end_local + 2);
      if ((long)end - (long)pbVar2 < 2) {
        enc_local._4_4_ = -1;
      }
      else {
        if (end_local[3] == '\0') {
          local_74 = (uint)(byte)ptr_local[(ulong)*pbVar2 + 0x80];
          end_local = (char *)pbVar2;
        }
        else {
          pcVar3 = end_local + 3;
          end_local = (char *)pbVar2;
          local_74 = unicode_byte_type(*pcVar3,*pbVar2);
        }
        switch(local_74) {
        case 9:
        case 10:
        case 0x15:
          do {
            pbVar2 = (byte *)(end_local + 2);
            if ((long)end - (long)pbVar2 < 2) {
              return -1;
            }
            if (end_local[3] == '\0') {
              local_84 = (uint)(byte)ptr_local[(ulong)*pbVar2 + 0x80];
              end_local = (char *)pbVar2;
            }
            else {
              pcVar3 = end_local + 3;
              end_local = (char *)pbVar2;
              local_84 = unicode_byte_type(*pcVar3,*pbVar2);
            }
            switch(local_84) {
            case 5:
              if ((long)end - (long)end_local < 2) {
                return -2;
              }
              *nextTokPtr = end_local;
              return 0;
            case 6:
              if ((long)end - (long)end_local < 3) {
                return -2;
              }
              *nextTokPtr = end_local;
              return 0;
            case 7:
              if ((long)end - (long)end_local < 4) {
                return -2;
              }
              *nextTokPtr = end_local;
              return 0;
            default:
              *nextTokPtr = end_local;
              return 0;
            case 9:
            case 10:
            case 0x15:
              break;
            case 0xb:
              goto LAB_00b9bdc2;
            case 0x11:
              goto LAB_00b9bddf;
            case 0x16:
            case 0x18:
              goto LAB_00b9be60;
            case 0x1d:
              if ((namingBitmap
                   [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[(byte)end_local[1]] * 8 +
                         ((int)(uint)(byte)*end_local >> 5))] & 1 << (*end_local & 0x1fU)) == 0) {
                *nextTokPtr = end_local;
                return 0;
              }
              goto LAB_00b9be60;
            }
          } while( true );
        case 0xb:
LAB_00b9bdc2:
          *nextTokPtr = end_local + 2;
          enc_local._4_4_ = 1;
          break;
        default:
          *nextTokPtr = end_local;
          enc_local._4_4_ = 0;
          break;
        case 0x11:
LAB_00b9bddf:
          pcVar3 = end_local + 2;
          if ((long)end - (long)pcVar3 < 2) {
            enc_local._4_4_ = -1;
          }
          else if ((end_local[3] == '\0') && (*pcVar3 == '>')) {
            *nextTokPtr = end_local + 4;
            enc_local._4_4_ = 3;
          }
          else {
            *nextTokPtr = pcVar3;
            enc_local._4_4_ = 0;
          }
        }
      }
      break;
    case 0x1d:
      if ((namingBitmap
           [(int)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[(byte)end_local[1]] * 8 +
                 ((int)(uint)(byte)*end_local >> 5))] & 1 << (*end_local & 0x1fU)) == 0) {
        *nextTokPtr = end_local;
        return 0;
      }
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto LAB_00b9be76;
    }
  }
  return enc_local._4_4_;
LAB_00b9be60:
LAB_00b9be76:
  end_local = end_local + 2;
  goto LAB_00b9b6cb;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr) {
#  ifdef XML_NS
  int hadColon = 0;
#  endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#  ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#  endif
    case BT_S:
    case BT_CR:
    case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_EQUALS: {
      int open;
#  ifdef XML_NS
      hadColon = 0;
#  endif
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        open = BYTE_TYPE(enc, ptr);
        if (open == BT_QUOT || open == BT_APOS)
          break;
        switch (open) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      ptr += MINBPC(enc);
      /* in attribute value */
      for (;;) {
        int t;
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == open)
          break;
        switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_AMP: {
          int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
          if (tok <= 0) {
            if (tok == XML_TOK_INVALID)
              *nextTokPtr = ptr;
            return tok;
          }
          break;
        }
        case BT_LT:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_CR:
      case BT_LF:
        break;
      case BT_SOL:
        goto sol;
      case BT_GT:
        goto gt;
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* ptr points to closing quote */
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
        case BT_S:
        case BT_CR:
        case BT_LF:
          continue;
        case BT_GT:
        gt:
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_START_TAG_WITH_ATTS;
        case BT_SOL:
        sol:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        break;
      }
      break;
    }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}